

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultIOSystem.cpp
# Opt level: O1

IOStream * __thiscall
Assimp::DefaultIOSystem::Open(DefaultIOSystem *this,char *strFile,char *strMode)

{
  FILE *pFVar1;
  IOStream *pIVar2;
  allocator<char> local_39;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  pFVar1 = fopen(strFile,strMode);
  if (pFVar1 == (FILE *)0x0) {
    pIVar2 = (IOStream *)0x0;
  }
  else {
    pIVar2 = (IOStream *)Intern::AllocateFromAssimpHeap::operator_new(0x38);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,strFile,&local_39);
    pIVar2->_vptr_IOStream = (_func_int **)&PTR__DefaultIOStream_008ff290;
    pIVar2[1]._vptr_IOStream = (_func_int **)pFVar1;
    pIVar2[2]._vptr_IOStream = (_func_int **)(pIVar2 + 4);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pIVar2 + 2),local_38,local_30 + (long)local_38);
    pIVar2[6]._vptr_IOStream = (_func_int **)0xffffffffffffffff;
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
    }
  }
  return pIVar2;
}

Assistant:

IOStream* DefaultIOSystem::Open(const char* strFile, const char* strMode)
{
    ai_assert(strFile != nullptr);
    ai_assert(strMode != nullptr);
    FILE* file;
#ifdef _WIN32
    file = ::_wfopen(Utf8ToWide(strFile).c_str(), Utf8ToWide(strMode).c_str());
#else
    file = ::fopen(strFile, strMode);
#endif
    if (!file)
        return nullptr;

    return new DefaultIOStream(file, strFile);
}